

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O3

void __thiscall
DHUDPicManager::DoDraw(DHUDPicManager *this,int linenum,int x,int y,int hudheight,float translucent)

{
  uint uVar1;
  FHudPic *pFVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (this->piclist).Count;
  if (uVar3 != 0) {
    lVar4 = 0xc;
    uVar5 = 0;
    do {
      pFVar2 = (this->piclist).Array;
      uVar1 = *(uint *)((long)pFVar2 + lVar4 + -0xc);
      if ((((0 < (long)(int)uVar1) &&
           (*(char *)((long)&(pFVar2->texturenum).texnum + lVar4) == '\x01')) &&
          (uVar1 < TexMan.Textures.Count)) &&
         (TexMan.Textures.Array[(int)uVar1].Texture != (FTexture *)0x0)) {
        DCanvas::DrawTexture
                  ((DCanvas *)screen,TexMan.Textures.Array[(int)uVar1].Texture,
                   (double)*(int *)((long)pFVar2 + lVar4 + -8),
                   (double)*(int *)((long)pFVar2 + lVar4 + -4),0x40001391,
                   (double)(this->basetrans * translucent),1,0x4000138c,0);
        uVar3 = (this->piclist).Count;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void DHUDPicManager::DoDraw (int linenum, int x, int y, int hudheight, float translucent)
{
	for(unsigned int i=0; i<piclist.Size();i++) if (piclist[i].texturenum.isValid() && piclist[i].draw)
	{
		FTexture * tex = TexMan[piclist[i].texturenum];
		if (tex) screen->DrawTexture(tex, piclist[i].xpos, piclist[i].ypos, DTA_320x200, true, 
										DTA_AlphaF, translucent*basetrans, TAG_DONE);
	}
}